

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O1

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::QuadratizeOrLinearize
          (EExpr *__return_storage_ptr__,
          ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
          *this,EExpr *el,EExpr *er)

{
  double dVar1;
  size_ty sVar2;
  size_ty sVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  AffineExpr local_358;
  LinTerms local_2d8;
  LinTerms local_260;
  EExpr local_1e8;
  
  if ((*(size_ty *)
        ((long)&(el->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.folded_.
                super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                .m_data.
                super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
        + 0x10) != 0) &&
     (*(size_ty *)
       ((long)&(er->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.folded_.
               super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
               m_data.
               super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
       + 0x10) != 0 ||
      *(size_ty *)
       ((long)&(er->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.coefs_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long> + 0x10) != 0)) {
    Convert2AffineExpr(&local_358,this,el);
    if (local_358.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity < 7) {
      local_260.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (ptr)&local_260.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                 m_storage;
      local_260.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
      if (local_358.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data
          .super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
        memcpy(local_260.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
               local_358.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
               m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
               local_358.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
               m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_size * 8);
      }
    }
    else {
      local_260.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           local_358.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
           m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
      local_260.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity =
           local_358.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
           m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
      local_358.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
      local_358.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
      local_358.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (ptr)&local_358.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>
                 .m_data.m_storage;
    }
    if (local_358.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
      local_260.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)&local_260.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
      local_260.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      if (local_358.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
        memcpy(local_260.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               local_358.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
               m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               local_358.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
               m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
      }
    }
    else {
      local_260.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           local_358.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
      local_260.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
           local_358.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
      local_358.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      local_358.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
      local_358.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)&local_358.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                 m_data.m_storage;
    }
    EExpr::EExpr(&local_1e8,&local_260);
    if (&local_1e8 != el) {
      gch::detail::small_vector_base<std::allocator<double>,_6U>::move_assign_default<6U,_nullptr>
                ((small_vector_base<std::allocator<double>,_6U> *)el,
                 (small_vector_base<std::allocator<double>,_6U> *)&local_1e8);
      gch::detail::small_vector_base<std::allocator<int>,_6U>::move_assign_default<6U,_nullptr>
                (&(el->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.vars_.
                  super_small_vector_base<std::allocator<int>,_6U>,
                 &local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
                  super_small_vector_base<std::allocator<int>,_6U>);
      gch::detail::small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::
      move_assign_default<8U,_nullptr>
                ((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
                 &(el->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms,
                 (small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
                 &local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms);
      gch::detail::small_vector_base<std::allocator<double>,_6U>::move_assign_default<6U,_nullptr>
                (&(el->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                  super_small_vector_base<std::allocator<double>,_6U>,
                 &local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                  super_small_vector_base<std::allocator<double>,_6U>);
      gch::detail::small_vector_base<std::allocator<int>,_6U>::move_assign_default<6U,_nullptr>
                (&(el->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                  super_small_vector_base<std::allocator<int>,_6U>,
                 &local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                  super_small_vector_base<std::allocator<int>,_6U>);
      gch::detail::small_vector_base<std::allocator<int>,_6U>::move_assign_default<6U,_nullptr>
                (&(el->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                  super_small_vector_base<std::allocator<int>,_6U>,
                 &local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                  super_small_vector_base<std::allocator<int>,_6U>);
    }
    (el->super_QuadraticExpr).constant_term_ = local_1e8.super_QuadraticExpr.constant_term_;
    if (6 < local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_
                      .super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_
                      .super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_
                      .super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_
                      .super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_
                      .super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_
                      .super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (8 < local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
            super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
            m_data.
            super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
            m_capacity) {
      operator_delete(local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_data_ptr,
                      local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_capacity << 4);
    }
    if (6 < local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (6 < local_260.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_260.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_260.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_260.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_260.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_260.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (6 < local_358.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_358.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_358.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_358.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
            m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_358.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_358.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
  }
  if ((*(size_ty *)
        ((long)&(er->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.folded_.
                super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                .m_data.
                super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
        + 0x10) != 0) &&
     (*(size_ty *)
       ((long)&(el->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.folded_.
               super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
               m_data.
               super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
       + 0x10) != 0 ||
      *(size_ty *)
       ((long)&(el->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.coefs_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long> + 0x10) != 0)) {
    Convert2AffineExpr(&local_358,this,er);
    local_2d8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_size =
         local_358.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_size;
    if (local_358.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity < 7) {
      local_2d8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (ptr)&local_2d8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                 m_storage;
      local_2d8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
      if (local_358.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data
          .super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
        memcpy(local_2d8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
               local_358.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
               m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
               local_358.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
               m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_size * 8);
      }
    }
    else {
      local_2d8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           local_358.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
           m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
      local_2d8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity =
           local_358.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
           m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
      local_358.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
      local_358.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
      local_358.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (ptr)&local_358.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>
                 .m_data.m_storage;
    }
    sVar2 = local_358.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_size;
    if (local_358.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
      local_2d8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)&local_2d8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
      local_2d8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      if (local_358.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
        memcpy(local_2d8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               local_358.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
               m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               local_358.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
               m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
      }
    }
    else {
      local_2d8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           local_358.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
      local_2d8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
           local_358.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
      local_358.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      local_358.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
      local_358.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)&local_358.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                 m_data.m_storage;
    }
    local_2d8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = sVar2;
    EExpr::EExpr(&local_1e8,&local_2d8);
    if (&local_1e8 != er) {
      gch::detail::small_vector_base<std::allocator<double>,_6U>::move_assign_default<6U,_nullptr>
                ((small_vector_base<std::allocator<double>,_6U> *)er,
                 (small_vector_base<std::allocator<double>,_6U> *)&local_1e8);
      gch::detail::small_vector_base<std::allocator<int>,_6U>::move_assign_default<6U,_nullptr>
                (&(er->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.vars_.
                  super_small_vector_base<std::allocator<int>,_6U>,
                 &local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
                  super_small_vector_base<std::allocator<int>,_6U>);
      gch::detail::small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::
      move_assign_default<8U,_nullptr>
                ((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
                 &(er->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms,
                 (small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
                 &local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms);
      gch::detail::small_vector_base<std::allocator<double>,_6U>::move_assign_default<6U,_nullptr>
                (&(er->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                  super_small_vector_base<std::allocator<double>,_6U>,
                 &local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                  super_small_vector_base<std::allocator<double>,_6U>);
      gch::detail::small_vector_base<std::allocator<int>,_6U>::move_assign_default<6U,_nullptr>
                (&(er->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                  super_small_vector_base<std::allocator<int>,_6U>,
                 &local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                  super_small_vector_base<std::allocator<int>,_6U>);
      gch::detail::small_vector_base<std::allocator<int>,_6U>::move_assign_default<6U,_nullptr>
                (&(er->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                  super_small_vector_base<std::allocator<int>,_6U>,
                 &local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                  super_small_vector_base<std::allocator<int>,_6U>);
    }
    (er->super_QuadraticExpr).constant_term_ = local_1e8.super_QuadraticExpr.constant_term_;
    if (6 < local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_
                      .super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_
                      .super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_
                      .super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_
                      .super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_
                      .super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_
                      .super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (8 < local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
            super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
            m_data.
            super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
            m_capacity) {
      operator_delete(local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_data_ptr,
                      local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_capacity << 4);
    }
    if (6 < local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_1e8.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (6 < local_2d8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_2d8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_2d8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_2d8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_2d8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_2d8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (6 < local_358.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_358.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_358.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_358.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
            m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_358.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_358.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
  }
  if (((this->ifFltCon_ != 0) ||
      ((this->flat_cvt_).
       super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
       .
       super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
       .options_.passQuadObj_ == 0)) &&
     (sVar2 = *(size_ty *)
               ((long)&(er->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.coefs_.
                       super_small_vector_base<std::allocator<double>,_6U>.m_data.
                       super_small_vector_data_base<double_*,_unsigned_long> + 0x10),
     *(size_ty *)
      ((long)&(er->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.folded_.
              super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
              m_data.
              super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
      + 0x10) != 0 || sVar2 != 0)) {
    sVar3 = *(size_ty *)
             ((long)&(el->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.coefs_.
                     super_small_vector_base<std::allocator<double>,_6U>.m_data.
                     super_small_vector_data_base<double_*,_unsigned_long> + 0x10);
    if ((sVar2 == sVar3) &&
       (*(size_ty *)
         ((long)&(el->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.folded_.
                 super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                 .m_data.
                 super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
         + 0x10) != 0 || sVar3 != 0)) {
      if ((((sVar2 == 1) &&
           ((dVar1 = (er->super_QuadraticExpr).constant_term_, dVar1 == 0.0 && (!NAN(dVar1))))) &&
          (dVar1 = (el->super_QuadraticExpr).constant_term_, dVar1 == 0.0)) &&
         ((!NAN(dVar1) &&
          (*(el->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.vars_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr ==
           *(er->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.vars_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr)))) {
        Convert2Pow2(__return_storage_ptr__,this,(LinTerms *)el,(LinTerms *)er);
        return __return_storage_ptr__;
      }
      LinTerms::sort_terms((LinTerms *)el,true);
      QuadTerms::sort_terms(&(el->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms);
      LinTerms::sort_terms((LinTerms *)er,true);
      QuadTerms::sort_terms(&(er->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms);
      bVar4 = AlgebraicExpression<mp::QuadAndLinTerms>::operator==
                        (&el->super_QuadraticExpr,&er->super_QuadraticExpr);
      if (bVar4) {
        Convert2Pow2(__return_storage_ptr__,this,el);
        return __return_storage_ptr__;
      }
    }
  }
  sVar2 = *(size_ty *)
           ((long)&(er->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.coefs_.
                   super_small_vector_base<std::allocator<double>,_6U>.m_data.
                   super_small_vector_data_base<double_*,_unsigned_long> + 0x10);
  if (((sVar2 == 0) ||
      (sVar3 = *(size_ty *)
                ((long)&(el->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long> + 0x10), sVar3 == 0))
     || ((this->ifFltCon_ == 0 &&
         (((this->flat_cvt_).
           super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           .
           super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           .options_.passQuadObj_ != 0 &&
          (auVar5._8_4_ = (int)(sVar3 >> 0x20), auVar5._0_8_ = sVar3, auVar5._12_4_ = 0x45300000,
          auVar6._8_4_ = (int)(sVar2 >> 0x20), auVar6._0_8_ = sVar2, auVar6._12_4_ = 0x45300000,
          ((auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) *
          ((auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) <=
          (this->flat_cvt_).
          super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          .
          super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          .options_.QPMultOutCard_)))))) {
    MultiplyOut(__return_storage_ptr__,el,er);
  }
  else {
    DontMultOut(__return_storage_ptr__,this,el,er);
  }
  return __return_storage_ptr__;
}

Assistant:

EExpr QuadratizeOrLinearize(EExpr& el, EExpr& er) {
    if (!el.is_affine() && !er.is_constant())
      el = Convert2AffineExpr(std::move(el));      // will convert to a new var now
    if (!er.is_affine() && !el.is_constant())
      er = Convert2AffineExpr(std::move(er));
    if (!IfQuadratizePow2() &&
        !er.is_constant() && !el.is_constant() &&
        er.GetLinTerms().size() == el.GetLinTerms().size()) {
      const auto& ellt = el.GetLinTerms();
      const auto& erlt = er.GetLinTerms();
      if (1 == erlt.size() &&    // same variable in el and er
          0.0 == er.constant_term() && 0.0 == el.constant_term() &&
          ellt.var(0) == erlt.var(0)) {
        return Convert2Pow2(ellt, erlt);
      }
      el.sort_terms();
      er.sort_terms();
      if  (el == er) {            // Convert expr*expr to expr^2
        return Convert2Pow2(std::move(el));
      }
    }  // Otherwise, we proceed to store proper multiplication,
    // unless the result is affine
    if (er.GetLinTerms().size() && el.GetLinTerms().size()  // both linear
        && (!IfMultOutQPTerms()
            || !IfMultOutQPTerms(el.GetLinTerms(), er.GetLinTerms()))) {
      // Create a separate QC with this product.
      // This is handy if we are walking the objective,
      // as MIPFlatCvt only linearizes QC.
      return DontMultOut(std::move(el), std::move(er));
    }
    return MultiplyOut(el, er);   // Quadratize
  }